

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

int Cut_CellTableLookup(Cut_CMan_t *p,Cut_Cell_t *pCell)

{
  Cut_Cell_t *pCVar1;
  long lVar2;
  Cut_Cell_t **ppCVar3;
  long lVar4;
  uint uVar5;
  char **in_RAX;
  Cut_Cell_t *pCVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Cut_Cell_t **pSlot;
  char **local_18;
  
  uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
  iVar7 = 1 << ((char)uVar5 - 5U & 0x1f);
  if (uVar5 < 6) {
    iVar7 = 1;
  }
  local_18 = in_RAX;
  uVar5 = Extra_TruthHash(pCell->uTruth,iVar7);
  iVar7 = st__find_or_add(p->tTable,(char *)(ulong)uVar5,&local_18);
  if (iVar7 == 0) {
    *local_18 = (char *)0x0;
  }
  pCVar1 = (Cut_Cell_t *)*local_18;
  if (pCVar1 != (Cut_Cell_t *)0x0) {
    uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
    uVar8 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
    pCVar6 = pCVar1;
    if (uVar5 < 6) {
      uVar8 = 1;
    }
    do {
      uVar9 = uVar8;
      if ((*(uint *)&pCVar6->field_0x20 & 0xf) == uVar5) {
        do {
          if ((long)uVar9 < 1) {
            return 1;
          }
          lVar4 = uVar9 - 1;
          lVar2 = uVar9 - 1;
          uVar9 = uVar9 - 1;
        } while (pCVar6->uTruth[lVar4] == pCell->uTruth[lVar2]);
      }
      ppCVar3 = &pCVar6->pNext;
      pCVar6 = *ppCVar3;
    } while (*ppCVar3 != (Cut_Cell_t *)0x0);
  }
  pCell->pNext = pCVar1;
  *local_18 = (char *)pCell;
  uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
  pCell->pNextVar = p->pSameVar[uVar5];
  p->pSameVar[uVar5] = pCell;
  return 0;
}

Assistant:

int Cut_CellTableLookup( Cut_CMan_t * p, Cut_Cell_t * pCell )
{
    Cut_Cell_t ** pSlot, * pTemp;
    unsigned Hash;
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum( pCell->nVars ) );
    if ( ! st__find_or_add( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char ***)&pSlot ) )
        *pSlot = NULL;
    for ( pTemp = *pSlot; pTemp; pTemp = pTemp->pNext )
    {
        if ( pTemp->nVars != pCell->nVars )
            continue;
        if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            return 1;
    }
    // the entry is new
    pCell->pNext = *pSlot;
    *pSlot = pCell;
    // add it to the variable support list
    pCell->pNextVar = p->pSameVar[pCell->nVars];
    p->pSameVar[pCell->nVars] = pCell;
    return 0;
}